

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O0

void __thiscall
kj::StringTree::
fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
          (StringTree *this,char *pos,undefined8 branchIndex,
          NoInfer<kj::ArrayPtr<const_char>_> *first,NoInfer<kj::ArrayPtr<const_char>_> *rest,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_1,NoInfer<kj::String> *rest_2,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_3,NoInfer<kj::CappedArray<char,_14UL>_> *rest_4,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_5,NoInfer<kj::ArrayPtr<const_char>_> *rest_6,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_7,NoInfer<kj::StringTree> *rest_8,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_9,NoInfer<kj::String> *rest_10,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_11,NoInfer<kj::ArrayPtr<const_char>_> *rest_12,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_13,NoInfer<kj::ArrayPtr<const_char>_> *rest_14,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_15,NoInfer<kj::ArrayPtr<const_char>_> *rest_16,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_17,NoInfer<kj::String> *rest_18,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_19,NoInfer<kj::CappedArray<char,_14UL>_> *rest_20
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_21,NoInfer<kj::ArrayPtr<const_char>_> *rest_22,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_23,NoInfer<kj::StringTree> *rest_24,
          NoInfer<kj::StringTree> *rest_25,NoInfer<kj::ArrayPtr<const_char>_> *rest_26,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_27,NoInfer<kj::ArrayPtr<const_char>_> *rest_28,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_29,NoInfer<kj::ArrayPtr<const_char>_> *rest_30,
          NoInfer<kj::String> *rest_31,NoInfer<kj::ArrayPtr<const_char>_> *rest_32,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_33,NoInfer<kj::ArrayPtr<const_char>_> *rest_34,
          NoInfer<kj::String> *rest_35,NoInfer<kj::ArrayPtr<const_char>_> *rest_36,
          NoInfer<kj::CappedArray<char,_14UL>_> *rest_37,NoInfer<kj::ArrayPtr<const_char>_> *rest_38
          ,NoInfer<kj::StringTree> *rest_39,NoInfer<kj::StringTree> *rest_40,
          NoInfer<kj::StringTree> *rest_41,NoInfer<kj::StringTree> *rest_42,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_43,NoInfer<kj::ArrayPtr<const_char>_> *rest_44,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_45,NoInfer<kj::ArrayPtr<const_char>_> *rest_46,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_47,NoInfer<kj::String> *rest_48,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_49,NoInfer<kj::ArrayPtr<const_char>_> *rest_50,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_51,NoInfer<kj::String> *rest_52,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_53,NoInfer<kj::CappedArray<char,_14UL>_> *rest_54
          ,NoInfer<kj::ArrayPtr<const_char>_> *rest_55,NoInfer<kj::StringTree> *rest_56,
          NoInfer<kj::StringTree> *rest_57,NoInfer<kj::ArrayPtr<const_char>_> *rest_58,
          NoInfer<kj::String> *rest_59,NoInfer<kj::ArrayPtr<const_char>_> *rest_60,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_61,NoInfer<kj::ArrayPtr<const_char>_> *rest_62,
          NoInfer<kj::ArrayPtr<const_char>_> *rest_63)

{
  ArrayPtr<const_char> *pAVar1;
  char *pcVar2;
  ArrayPtr<const_char> *pAVar3;
  String *pSVar4;
  ArrayPtr<const_char> *pAVar5;
  CappedArray<char,_14UL> *pCVar6;
  ArrayPtr<const_char> *pAVar7;
  ArrayPtr<const_char> *pAVar8;
  ArrayPtr<const_char> *pAVar9;
  StringTree *pSVar10;
  ArrayPtr<const_char> *pAVar11;
  String *pSVar12;
  ArrayPtr<const_char> *pAVar13;
  ArrayPtr<const_char> *pAVar14;
  ArrayPtr<const_char> *pAVar15;
  ArrayPtr<const_char> *pAVar16;
  ArrayPtr<const_char> *pAVar17;
  ArrayPtr<const_char> *pAVar18;
  ArrayPtr<const_char> *pAVar19;
  String *pSVar20;
  ArrayPtr<const_char> *pAVar21;
  CappedArray<char,_14UL> *pCVar22;
  ArrayPtr<const_char> *pAVar23;
  ArrayPtr<const_char> *pAVar24;
  ArrayPtr<const_char> *pAVar25;
  StringTree *pSVar26;
  StringTree *pSVar27;
  ArrayPtr<const_char> *pAVar28;
  ArrayPtr<const_char> *pAVar29;
  ArrayPtr<const_char> *pAVar30;
  ArrayPtr<const_char> *pAVar31;
  ArrayPtr<const_char> *pAVar32;
  String *pSVar33;
  ArrayPtr<const_char> *pAVar34;
  ArrayPtr<const_char> *pAVar35;
  ArrayPtr<const_char> *pAVar36;
  String *pSVar37;
  ArrayPtr<const_char> *pAVar38;
  CappedArray<char,_14UL> *pCVar39;
  ArrayPtr<const_char> *pAVar40;
  StringTree *pSVar41;
  StringTree *pSVar42;
  StringTree *pSVar43;
  StringTree *pSVar44;
  ArrayPtr<const_char> *pAVar45;
  ArrayPtr<const_char> *pAVar46;
  ArrayPtr<const_char> *pAVar47;
  ArrayPtr<const_char> *pAVar48;
  ArrayPtr<const_char> *pAVar49;
  String *pSVar50;
  ArrayPtr<const_char> *pAVar51;
  ArrayPtr<const_char> *pAVar52;
  ArrayPtr<const_char> *pAVar53;
  String *pSVar54;
  ArrayPtr<const_char> *pAVar55;
  CappedArray<char,_14UL> *pCVar56;
  ArrayPtr<const_char> *pAVar57;
  StringTree *pSVar58;
  StringTree *pSVar59;
  ArrayPtr<const_char> *pAVar60;
  String *pSVar61;
  ArrayPtr<const_char> *pAVar62;
  ArrayPtr<const_char> *pAVar63;
  ArrayPtr<const_char> *pAVar64;
  ArrayPtr<const_char> *pAVar65;
  ArrayPtr<const_char> *pAVar66;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_000001f8;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000200;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000208;
  NoInfer<kj::String> *in_stack_00000210;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000218;
  NoInfer<kj::CappedArray<char,_14UL>_> *in_stack_00000220;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000228;
  NoInfer<kj::StringTree> *in_stack_00000230;
  NoInfer<kj::StringTree> *in_stack_00000238;
  NoInfer<kj::ArrayPtr<const_char>_> *in_stack_00000240;
  ArrayPtr<const_char> *rest_local_1;
  ArrayPtr<const_char> *rest_local;
  ArrayPtr<const_char> *first_local;
  size_t branchIndex_local;
  char *pos_local;
  StringTree *this_local;
  
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(first);
  pcVar2 = _::fill<kj::ArrayPtr<char_const>>(pos,pAVar1);
  pAVar1 = fwd<kj::ArrayPtr<char_const>>(rest);
  pAVar3 = fwd<kj::ArrayPtr<char_const>>(rest_1);
  pSVar4 = fwd<kj::String>(rest_2);
  pAVar5 = fwd<kj::ArrayPtr<char_const>>(rest_3);
  pCVar6 = fwd<kj::CappedArray<char,14ul>>(rest_4);
  pAVar7 = fwd<kj::ArrayPtr<char_const>>(rest_5);
  pAVar8 = fwd<kj::ArrayPtr<char_const>>(rest_6);
  pAVar9 = fwd<kj::ArrayPtr<char_const>>(rest_7);
  pSVar10 = fwd<kj::StringTree>(rest_8);
  pAVar11 = fwd<kj::ArrayPtr<char_const>>(rest_9);
  pSVar12 = fwd<kj::String>(rest_10);
  pAVar13 = fwd<kj::ArrayPtr<char_const>>(rest_11);
  pAVar14 = fwd<kj::ArrayPtr<char_const>>(rest_12);
  pAVar15 = fwd<kj::ArrayPtr<char_const>>(rest_13);
  pAVar16 = fwd<kj::ArrayPtr<char_const>>(rest_14);
  pAVar17 = fwd<kj::ArrayPtr<char_const>>(rest_15);
  pAVar18 = fwd<kj::ArrayPtr<char_const>>(rest_16);
  pAVar19 = fwd<kj::ArrayPtr<char_const>>(rest_17);
  pSVar20 = fwd<kj::String>(rest_18);
  pAVar21 = fwd<kj::ArrayPtr<char_const>>(rest_19);
  pCVar22 = fwd<kj::CappedArray<char,14ul>>(rest_20);
  pAVar23 = fwd<kj::ArrayPtr<char_const>>(rest_21);
  pAVar24 = fwd<kj::ArrayPtr<char_const>>(rest_22);
  pAVar25 = fwd<kj::ArrayPtr<char_const>>(rest_23);
  pSVar26 = fwd<kj::StringTree>(rest_24);
  pSVar27 = fwd<kj::StringTree>(rest_25);
  pAVar28 = fwd<kj::ArrayPtr<char_const>>(rest_26);
  pAVar29 = fwd<kj::ArrayPtr<char_const>>(rest_27);
  pAVar30 = fwd<kj::ArrayPtr<char_const>>(rest_28);
  pAVar31 = fwd<kj::ArrayPtr<char_const>>(rest_29);
  pAVar32 = fwd<kj::ArrayPtr<char_const>>(rest_30);
  pSVar33 = fwd<kj::String>(rest_31);
  pAVar34 = fwd<kj::ArrayPtr<char_const>>(rest_32);
  pAVar35 = fwd<kj::ArrayPtr<char_const>>(rest_33);
  pAVar36 = fwd<kj::ArrayPtr<char_const>>(rest_34);
  pSVar37 = fwd<kj::String>(rest_35);
  pAVar38 = fwd<kj::ArrayPtr<char_const>>(rest_36);
  pCVar39 = fwd<kj::CappedArray<char,14ul>>(rest_37);
  pAVar40 = fwd<kj::ArrayPtr<char_const>>(rest_38);
  pSVar41 = fwd<kj::StringTree>(rest_39);
  pSVar42 = fwd<kj::StringTree>(rest_40);
  pSVar43 = fwd<kj::StringTree>(rest_41);
  pSVar44 = fwd<kj::StringTree>(rest_42);
  pAVar45 = fwd<kj::ArrayPtr<char_const>>(rest_43);
  pAVar46 = fwd<kj::ArrayPtr<char_const>>(rest_44);
  pAVar47 = fwd<kj::ArrayPtr<char_const>>(rest_45);
  pAVar48 = fwd<kj::ArrayPtr<char_const>>(rest_46);
  pAVar49 = fwd<kj::ArrayPtr<char_const>>(rest_47);
  pSVar50 = fwd<kj::String>(rest_48);
  pAVar51 = fwd<kj::ArrayPtr<char_const>>(rest_49);
  pAVar52 = fwd<kj::ArrayPtr<char_const>>(rest_50);
  pAVar53 = fwd<kj::ArrayPtr<char_const>>(rest_51);
  pSVar54 = fwd<kj::String>(rest_52);
  pAVar55 = fwd<kj::ArrayPtr<char_const>>(rest_53);
  pCVar56 = fwd<kj::CappedArray<char,14ul>>(rest_54);
  pAVar57 = fwd<kj::ArrayPtr<char_const>>(rest_55);
  pSVar58 = fwd<kj::StringTree>(rest_56);
  pSVar59 = fwd<kj::StringTree>(rest_57);
  pAVar60 = fwd<kj::ArrayPtr<char_const>>(rest_58);
  pSVar61 = fwd<kj::String>(rest_59);
  pAVar62 = fwd<kj::ArrayPtr<char_const>>(rest_60);
  pAVar63 = fwd<kj::ArrayPtr<char_const>>(rest_61);
  pAVar64 = fwd<kj::ArrayPtr<char_const>>(rest_62);
  pAVar65 = fwd<kj::ArrayPtr<char_const>>(rest_63);
  pAVar66 = fwd<kj::ArrayPtr<char_const>>(in_stack_000001f8);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000200);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000208);
  fwd<kj::String>(in_stack_00000210);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000218);
  fwd<kj::CappedArray<char,14ul>>(in_stack_00000220);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000228);
  fwd<kj::StringTree>(in_stack_00000230);
  fwd<kj::StringTree>(in_stack_00000238);
  fwd<kj::ArrayPtr<char_const>>(in_stack_00000240);
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::String,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::ArrayPtr<char_const>,kj::StringTree,kj::StringTree,kj::ArrayPtr<char_const>>
            (this,pcVar2,branchIndex,pAVar1,pAVar3,pSVar4,pAVar5,pCVar6,pAVar7,pAVar8,pAVar9,pSVar10
             ,pAVar11,pSVar12,pAVar13,pAVar14,pAVar15,pAVar16,pAVar17,pAVar18,pAVar19,pSVar20,
             pAVar21,pCVar22,pAVar23,pAVar24,pAVar25,pSVar26,pSVar27,pAVar28,pAVar29,pAVar30,pAVar31
             ,pAVar32,pSVar33,pAVar34,pAVar35,pAVar36,pSVar37,pAVar38,pCVar39,pAVar40,pSVar41,
             pSVar42,pSVar43,pSVar44,pAVar45,pAVar46,pAVar47,pAVar48,pAVar49,pSVar50,pAVar51,pAVar52
             ,pAVar53,pSVar54,pAVar55,pCVar56,pAVar57,pSVar58,pSVar59,pAVar60,pSVar61,pAVar62,
             pAVar63,pAVar64,pAVar65,pAVar66);
  return;
}

Assistant:

void StringTree::fill(char* pos, size_t branchIndex, First&& first, Rest&&... rest) {
  pos = _::fill(pos, kj::fwd<First>(first));
  fill(pos, branchIndex, kj::fwd<Rest>(rest)...);
}